

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

optional<tinyusdz::value::texcoord3h> * __thiscall
tinyusdz::primvar::PrimVar::get_value<tinyusdz::value::texcoord3h>
          (optional<tinyusdz::value::texcoord3h> *__return_storage_ptr__,PrimVar *this)

{
  bool bVar1;
  optional<tinyusdz::value::texcoord3h> local_22;
  PrimVar *local_18;
  PrimVar *this_local;
  
  local_18 = this;
  this_local = (PrimVar *)__return_storage_ptr__;
  bVar1 = is_blocked(this);
  if (bVar1) {
    nonstd::optional_lite::optional<tinyusdz::value::texcoord3h>::optional(__return_storage_ptr__);
  }
  else {
    bVar1 = has_default(this);
    if (bVar1) {
      tinyusdz::value::Value::get_value<tinyusdz::value::texcoord3h>(&local_22,&this->_value,false);
      nonstd::optional_lite::optional<tinyusdz::value::texcoord3h>::
      optional<tinyusdz::value::texcoord3h,_0>(__return_storage_ptr__,&local_22);
      nonstd::optional_lite::optional<tinyusdz::value::texcoord3h>::~optional(&local_22);
    }
    else {
      nonstd::optional_lite::optional<tinyusdz::value::texcoord3h>::optional(__return_storage_ptr__)
      ;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {

    if (is_blocked()) {
      return nonstd::nullopt;
    }

    if (!has_default()) {
      return nonstd::nullopt;
    }

    return _value.get_value<T>();
  }